

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall
fizplex::LPTest_AddColumnIncreasesColumnCount_Test::TestBody
          (LPTest_AddColumnIncreasesColumnCount_Test *this)

{
  size_t sVar1;
  char *in_R9;
  AssertHelper AStack_d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string local_c8;
  AssertionResult gtest_ar_;
  LP lp;
  
  LP::LP(&lp);
  LP::add_column(&lp,Bounded,-1.33333,302.0,0.0);
  sVar1 = LP::column_count(&lp);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar1 == 1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&gtest_ar_,(AssertionResult *)"lp.column_count() == 1","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x35,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  LP::~LP(&lp);
  return;
}

Assistant:

TEST(LPTest, AddColumnIncreasesColumnCount) {
  LP lp;
  lp.add_column(ColType::Bounded, -1.33333, 302);
  EXPECT_TRUE(lp.column_count() == 1);
}